

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void flatbuffers::tests::anon_unknown_0::FixedLengthArrayJsonTest
               (string *tests_data_path,bool binary)

{
  FlatBufferBuilder *this;
  bool bVar1;
  int expval;
  uint8_t *puVar2;
  uint8_t *__s2;
  char *pcVar3;
  string schemafile;
  string jsonGen;
  string jsonfile;
  Verifier verifierGen;
  Verifier verifierOrg;
  Parser parserOrg;
  Parser parserGen;
  
  schemafile._M_dataplus._M_p = (pointer)&schemafile.field_2;
  schemafile._M_string_length = 0;
  schemafile.field_2._M_local_buf[0] = '\0';
  jsonfile._M_dataplus._M_p = (pointer)&jsonfile.field_2;
  jsonfile._M_string_length = 0;
  jsonfile.field_2._M_local_buf[0] = '\0';
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parserGen,
                 tests_data_path,"arrays_test.");
  pcVar3 = "fbs";
  if (binary) {
    pcVar3 = "bfbs";
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parserOrg,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parserGen,
                 pcVar3);
  bVar1 = LoadFile(parserOrg.super_ParserState.prev_cursor_,binary,&schemafile);
  TestEq<bool,bool>(bVar1,true,
                    "\'flatbuffers::LoadFile( (tests_data_path + \"arrays_test.\" + (binary ? \"bfbs\" : \"fbs\")) .c_str(), binary, &schemafile)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                    ,0x3a6,"");
  std::__cxx11::string::~string((string *)&parserOrg);
  std::__cxx11::string::~string((string *)&parserGen);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parserOrg,
                 tests_data_path,"arrays_test.golden");
  bVar1 = LoadFile(parserOrg.super_ParserState.prev_cursor_,false,&jsonfile);
  TestEq<bool,bool>(bVar1,true,
                    "\'flatbuffers::LoadFile((tests_data_path + \"arrays_test.golden\").c_str(), false, &jsonfile)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                    ,0x3aa,"");
  std::__cxx11::string::~string((string *)&parserOrg);
  IDLOptions::IDLOptions((IDLOptions *)&parserGen);
  Parser::Parser(&parserOrg,(IDLOptions *)&parserGen);
  IDLOptions::~IDLOptions((IDLOptions *)&parserGen);
  IDLOptions::IDLOptions((IDLOptions *)&verifierOrg);
  Parser::Parser(&parserGen,(IDLOptions *)&verifierOrg);
  IDLOptions::~IDLOptions((IDLOptions *)&verifierOrg);
  if (binary) {
    VerifierTemplate<false>::VerifierTemplate
              (&verifierOrg,(uint8_t *)schemafile._M_dataplus._M_p,schemafile._M_string_length,0x40,
               1000000,true);
    bVar1 = reflection::VerifySchemaBuffer(&verifierOrg);
    TestEq<bool,bool>(bVar1,true,"\'reflection::VerifySchemaBuffer(verifier)\' != \'true\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                      ,0x3b2,"");
    bVar1 = Parser::Deserialize(&parserOrg,(uint8_t *)schemafile._M_dataplus._M_p,
                                schemafile._M_string_length);
    TestEq<bool,bool>(bVar1,true,
                      "\'parserOrg.Deserialize( reinterpret_cast<const uint8_t *>(schemafile.c_str()), schemafile.size())\' != \'true\'"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                      ,0x3b6,"");
    bVar1 = Parser::Deserialize(&parserGen,(uint8_t *)schemafile._M_dataplus._M_p,
                                schemafile._M_string_length);
    TestEq<bool,bool>(bVar1,true,
                      "\'parserGen.Deserialize( reinterpret_cast<const uint8_t *>(schemafile.c_str()), schemafile.size())\' != \'true\'"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                      ,0x3ba,"");
  }
  else {
    bVar1 = Parser::Parse(&parserOrg,schemafile._M_dataplus._M_p,(char **)0x0,(char *)0x0);
    TestEq<bool,bool>(bVar1,true,"\'parserOrg.Parse(schemafile.c_str())\' != \'true\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                      ,0x3bc,"");
    bVar1 = Parser::Parse(&parserGen,schemafile._M_dataplus._M_p,(char **)0x0,(char *)0x0);
    TestEq<bool,bool>(bVar1,true,"\'parserGen.Parse(schemafile.c_str())\' != \'true\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                      ,0x3bd,"");
  }
  bVar1 = Parser::Parse(&parserOrg,jsonfile._M_dataplus._M_p,(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar1,true,"\'parserOrg.Parse(jsonfile.c_str())\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                    ,0x3bf,"");
  this = &parserOrg.builder_;
  puVar2 = FlatBufferBuilderImpl<false>::GetBufferPointer(this);
  VerifierTemplate<false>::VerifierTemplate
            (&verifierOrg,puVar2,(ulong)parserOrg.builder_.buf_.size_,0x40,1000000,true);
  bVar1 = MyGame::Example::VerifyArrayTableBuffer(&verifierOrg);
  TestEq<bool,bool>(bVar1,true,"\'VerifyArrayTableBuffer(verifierOrg)\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                    ,0x3c4,"");
  jsonGen._M_dataplus._M_p = (pointer)&jsonGen.field_2;
  jsonGen._M_string_length = 0;
  jsonGen.field_2._M_local_buf[0] = '\0';
  puVar2 = FlatBufferBuilderImpl<false>::GetBufferPointer(this);
  pcVar3 = GenText(&parserOrg,puVar2,&jsonGen);
  TestEq<bool,bool>(true,pcVar3 == (char *)0x0,
                    "\'nullptr\' != \'GenText(parserOrg, parserOrg.builder_.GetBufferPointer(), &jsonGen)\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                    ,0x3c9,"");
  bVar1 = Parser::Parse(&parserGen,jsonGen._M_dataplus._M_p,(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar1,true,"\'parserGen.Parse(jsonGen.c_str())\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                    ,0x3cc,"");
  puVar2 = FlatBufferBuilderImpl<false>::GetBufferPointer(&parserGen.builder_);
  VerifierTemplate<false>::VerifierTemplate
            (&verifierGen,puVar2,(ulong)parserGen.builder_.buf_.size_,0x40,1000000,true);
  bVar1 = MyGame::Example::VerifyArrayTableBuffer(&verifierGen);
  TestEq<bool,bool>(bVar1,true,"\'VerifyArrayTableBuffer(verifierGen)\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                    ,0x3d1,"");
  TestEq<unsigned_int,unsigned_int>
            (parserOrg.builder_.buf_.size_,parserGen.builder_.buf_.size_,
             "\'parserOrg.builder_.GetSize()\' != \'parserGen.builder_.GetSize()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
             ,0x3d4,"");
  puVar2 = FlatBufferBuilderImpl<false>::GetBufferPointer(this);
  __s2 = FlatBufferBuilderImpl<false>::GetBufferPointer(&parserGen.builder_);
  expval = memcmp(puVar2,__s2,(ulong)parserOrg.builder_.buf_.size_);
  TestEq<int,int>(expval,0,
                  "\'std::memcmp(parserOrg.builder_.GetBufferPointer(), parserGen.builder_.GetBufferPointer(), parserOrg.builder_.GetSize())\' != \'0\'"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                  ,0x3d8,"");
  std::__cxx11::string::~string((string *)&jsonGen);
  Parser::~Parser(&parserGen);
  Parser::~Parser(&parserOrg);
  std::__cxx11::string::~string((string *)&jsonfile);
  std::__cxx11::string::~string((string *)&schemafile);
  return;
}

Assistant:

void FixedLengthArrayJsonTest(const std::string &tests_data_path, bool binary) {
  // load FlatBuffer schema (.fbs) and JSON from disk
  std::string schemafile;
  std::string jsonfile;
  TEST_EQ(flatbuffers::LoadFile(
              (tests_data_path + "arrays_test." + (binary ? "bfbs" : "fbs"))
                  .c_str(),
              binary, &schemafile),
          true);
  TEST_EQ(
      flatbuffers::LoadFile((tests_data_path + "arrays_test.golden").c_str(),
                            false, &jsonfile),
      true);

  // parse schema first, so we can use it to parse the data after
  flatbuffers::Parser parserOrg, parserGen;
  if (binary) {
    flatbuffers::Verifier verifier(
        reinterpret_cast<const uint8_t *>(schemafile.c_str()),
        schemafile.size());
    TEST_EQ(reflection::VerifySchemaBuffer(verifier), true);
    TEST_EQ(parserOrg.Deserialize(
                reinterpret_cast<const uint8_t *>(schemafile.c_str()),
                schemafile.size()),
            true);
    TEST_EQ(parserGen.Deserialize(
                reinterpret_cast<const uint8_t *>(schemafile.c_str()),
                schemafile.size()),
            true);
  } else {
    TEST_EQ(parserOrg.Parse(schemafile.c_str()), true);
    TEST_EQ(parserGen.Parse(schemafile.c_str()), true);
  }
  TEST_EQ(parserOrg.Parse(jsonfile.c_str()), true);

  // First, verify it, just in case:
  flatbuffers::Verifier verifierOrg(parserOrg.builder_.GetBufferPointer(),
                                    parserOrg.builder_.GetSize());
  TEST_EQ(VerifyArrayTableBuffer(verifierOrg), true);

  // Export to JSON
  std::string jsonGen;
  TEST_NULL(
      GenText(parserOrg, parserOrg.builder_.GetBufferPointer(), &jsonGen));

  // Import from JSON
  TEST_EQ(parserGen.Parse(jsonGen.c_str()), true);

  // Verify buffer from generated JSON
  flatbuffers::Verifier verifierGen(parserGen.builder_.GetBufferPointer(),
                                    parserGen.builder_.GetSize());
  TEST_EQ(VerifyArrayTableBuffer(verifierGen), true);

  // Compare generated buffer to original
  TEST_EQ(parserOrg.builder_.GetSize(), parserGen.builder_.GetSize());
  TEST_EQ(std::memcmp(parserOrg.builder_.GetBufferPointer(),
                      parserGen.builder_.GetBufferPointer(),
                      parserOrg.builder_.GetSize()),
          0);
}